

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

int strbin(char *str)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  
  iVar6 = (int)str;
  pbVar5 = (byte *)str;
  do {
    while( true ) {
      pbVar3 = pbVar5 + 1;
      bVar7 = *pbVar5;
      if (bVar7 == 0x5c) break;
      if (bVar7 == 0) {
        *str = 0;
        return (int)str - iVar6;
      }
      *str = bVar7;
      str = (char *)((byte *)str + 1);
      pbVar5 = pbVar3;
    }
    bVar7 = *pbVar3;
    pbVar4 = pbVar3;
    if (bVar7 < 0x58) {
      if (bVar7 - 0x30 < 8) {
        pbVar4 = pbVar5 + 4;
        lVar9 = 0;
        bVar7 = 0;
        do {
          bVar7 = bVar7 * '\b';
          if ((pbVar5[lVar9 + 1] & 0xf8) != 0x30) {
            pbVar4 = pbVar5 + lVar9;
            break;
          }
          bVar7 = (bVar7 + pbVar5[lVar9 + 1]) - 0x30;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 3);
        goto switchD_0035b327_caseD_64;
      }
      if (bVar7 != 10) goto switchD_0035b327_caseD_64;
    }
    else {
      switch(bVar7) {
      case 0x6e:
        bVar7 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        break;
      case 0x72:
        bVar7 = 0xd;
        break;
      case 0x74:
        bVar7 = 9;
        break;
      case 0x76:
        bVar7 = 0xb;
        break;
      case 0x78:
switchD_0035b336_caseD_78:
        iVar8 = 1;
        bVar7 = 0;
        do {
          bVar1 = pbVar3[1];
          cVar2 = -0x30;
          if (((9 < (byte)(bVar1 - 0x30)) && (cVar2 = -0x57, 5 < (byte)(bVar1 + 0x9f))) &&
             (cVar2 = -0x37, pbVar4 = pbVar3, 5 < (byte)(bVar1 + 0xbf))) break;
          pbVar3 = pbVar3 + 1;
          bVar7 = bVar7 * '\x10' + cVar2 + bVar1;
          iVar8 = iVar8 + -1;
          pbVar4 = pbVar5 + 3;
        } while (iVar8 == 0);
        break;
      default:
        switch(bVar7) {
        case 0x61:
          bVar7 = 7;
          break;
        case 0x62:
          bVar7 = 8;
          break;
        case 99:
          bVar7 = 0x1c;
          break;
        case 100:
        case 0x65:
          break;
        case 0x66:
          bVar7 = 0xc;
          break;
        default:
          if (bVar7 == 0x58) goto switchD_0035b336_caseD_78;
        }
      }
switchD_0035b327_caseD_64:
      *str = bVar7;
      str = (char *)((byte *)str + 1);
      pbVar3 = pbVar4;
    }
    pbVar5 = pbVar3 + 1;
  } while( true );
}

Assistant:

int strbin (char *str)
{
	char *start = str;
	char *p = str, c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			*str++ = c;
		} else {
			switch (*p) {
				case 'a':
					*str++ = '\a';
					break;
				case 'b':
					*str++ = '\b';
					break;
				case 'c':
					*str++ = '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					*str++ = '\f';
					break;
				case 'n':
					*str++ = '\n';
					break;
				case 't':
					*str++ = '\t';
					break;
				case 'r':
					*str++ = '\r';
					break;
				case 'v':
					*str++ = '\v';
					break;
				case '?':
					*str++ = '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					*str++ = c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
						{
							p--;
							break;
						}
						p++;
					}
					*str++ = c;
					break;
				default:
					*str++ = *p;
					break;
			}
			p++;
		}
	}
	*str = 0;
	return int(str - start);
}